

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O1

void helicsMessageCopy(HelicsMessage source_message,HelicsMessage dest_message,HelicsError *err)

{
  size_t size;
  undefined8 *puVar1;
  undefined8 *puVar2;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (source_message == (HelicsMessage)0x0) {
      if (err != (HelicsError *)0x0) goto LAB_001b036b;
      goto LAB_001b037c;
    }
    puVar1 = (undefined8 *)0x0;
    if (*(short *)((long)source_message + 10) == 0xb3) {
      puVar1 = (undefined8 *)source_message;
    }
    if (*(short *)((long)source_message + 10) != 0xb3 && err != (HelicsError *)0x0) {
LAB_001b036b:
      err->error_code = -4;
      err->message = "The message object was not valid";
      goto LAB_001b037c;
    }
  }
  else {
LAB_001b037c:
    puVar1 = (undefined8 *)0x0;
  }
  if (puVar1 == (undefined8 *)0x0) {
    return;
  }
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (dest_message == (HelicsMessage)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001b03d7;
    }
    else {
      puVar2 = (undefined8 *)0x0;
      if (*(short *)((long)dest_message + 10) == 0xb3) {
        puVar2 = (undefined8 *)dest_message;
      }
      if (*(short *)((long)dest_message + 10) == 0xb3 || err == (HelicsError *)0x0)
      goto LAB_001b03da;
    }
    err->error_code = -4;
    err->message = "The message object was not valid";
  }
LAB_001b03d7:
  puVar2 = (undefined8 *)0x0;
LAB_001b03da:
  if (puVar2 != (undefined8 *)0x0) {
    if (puVar2 != puVar1) {
      size = puVar1[10];
      helics::SmallBuffer::reserve((SmallBuffer *)(puVar2 + 2),size);
      puVar2[10] = size;
      memcpy((void *)puVar2[0xc],(void *)puVar1[0xc],puVar1[10]);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(puVar2 + 0xe),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(puVar1 + 0xe));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(puVar2 + 0x16),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(puVar1 + 0x16))
    ;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(puVar2 + 0x12),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(puVar1 + 0x12))
    ;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(puVar2 + 0x1a),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(puVar1 + 0x1a))
    ;
    *puVar2 = *puVar1;
    *(undefined4 *)((long)puVar2 + 0xc) = *(undefined4 *)((long)puVar1 + 0xc);
    *(undefined2 *)(puVar2 + 1) = *(undefined2 *)(puVar1 + 1);
  }
  return;
}

Assistant:

void helicsMessageCopy(HelicsMessage source_message, HelicsMessage dest_message, HelicsError* err)
{
    auto* mess_src = getMessageObj(source_message, err);
    if (mess_src == nullptr) {
        return;
    }
    auto* mess_dest = getMessageObj(dest_message, err);
    if (mess_dest == nullptr) {
        return;
    }
    mess_dest->data = mess_src->data;
    mess_dest->dest = mess_src->dest;
    mess_dest->original_source = mess_src->original_source;
    mess_dest->source = mess_src->source;
    mess_dest->original_dest = mess_src->original_dest;
    mess_dest->time = mess_src->time;
    mess_dest->messageID = mess_src->messageID;
    mess_dest->flags = mess_src->flags;
}